

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

void __thiscall Entity::setRotation(Entity *this,float rotation)

{
  for (; 270.0 < rotation; rotation = rotation + -360.0) {
  }
  for (; rotation < 0.0; rotation = rotation + 360.0) {
  }
  this->rotation = (int)rotation;
  return;
}

Assistant:

void Entity::setRotation(float rotation) {
    float actualRotation = rotation;
    while (actualRotation > 270) {
        actualRotation -= 360;
    }
    while (actualRotation < 0) {
        actualRotation += 360;
    }
    this->rotation = actualRotation;
}